

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covscript.cpp
# Opt level: O0

int cs::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  any *in_stack_ffffffffffffffb8;
  int iVar1;
  __fn *p_Var2;
  EVP_PKEY_CTX local_18 [8];
  void *local_10;
  __fn *local_8;
  
  p_Var2 = __fn;
  local_10 = __child_stack;
  local_8 = __fn;
  cs_impl::any::any((any *)__fn,in_stack_ffffffffffffffb8);
  iVar1 = (int)p_Var2;
  copy((EVP_PKEY_CTX *)__fn,local_18);
  cs_impl::any::~any((any *)0x52f4ca);
  return iVar1;
}

Assistant:

var clone(const var &val)
	{
		return copy(val);
	}